

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcFastenerType::~IfcFastenerType(IfcFastenerType *this)

{
  IfcFastenerType *this_local;
  
  ~IfcFastenerType(this,&VTT);
  STEP::Object::~Object((Object *)&(this->super_IfcElementComponentType).field_0x1a0);
  return;
}

Assistant:

IfcFastenerType() : Object("IfcFastenerType") {}